

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O2

class_t * __thiscall
cfgfile::generator::cfg::tag_class_t::cfg(class_t *__return_storage_ptr__,tag_class_t *this)

{
  tag_base_class_t *this_00;
  pos_t pVar1;
  bool bVar2;
  tag_field_t *ptVar3;
  size_t i;
  ulong uVar4;
  field_t fStack_c8;
  
  class_t::class_t(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  this_00 = &this->m_base_class_name;
  bVar2 = tag_t<cfgfile::string_trait_t>::is_defined((tag_t<cfgfile::string_trait_t> *)this_00);
  if (bVar2) {
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->m_base_name);
    tag_base_class_t::tag_name_abi_cxx11_((string *)&fStack_c8,this_00);
    std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->m_tag_name);
    std::__cxx11::string::~string((string *)&fStack_c8);
    bVar2 = std::operator!=(&__return_storage_ptr__->m_base_name,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            c_no_value_tag_name_abi_cxx11_);
    if (bVar2) {
      std::__cxx11::string::string
                ((string *)&fStack_c8,(string *)&(this->m_base_class_name).m_value_type.m_value);
      std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->m_base_value_type);
      std::__cxx11::string::~string((string *)&fStack_c8);
      tag_base_class_t::cfg(&fStack_c8,this_00);
      std::
      vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>::
      push_back(&__return_storage_ptr__->m_fields,&fStack_c8);
      field_t::~field_t(&fStack_c8);
    }
  }
  pVar1 = (this->
          super_tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
          ).super_tag_t<cfgfile::string_trait_t>.m_column_number;
  __return_storage_ptr__->m_line_number =
       (this->
       super_tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
       ).super_tag_t<cfgfile::string_trait_t>.m_line_number;
  __return_storage_ptr__->m_column_number = pVar1;
  bVar2 = tag_t<cfgfile::string_trait_t>::is_defined
                    (&(this->m_scalar_tags).super_tag_t<cfgfile::string_trait_t>);
  if (bVar2) {
    for (uVar4 = 0;
        uVar4 < (ulong)((long)(this->m_scalar_tags).m_tags.
                              super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_scalar_tags).m_tags.
                              super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4); uVar4 = uVar4 + 1) {
      ptVar3 = tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>::
               at(&this->m_scalar_tags,uVar4);
      tag_field_t::cfg(&fStack_c8,ptVar3);
      std::
      vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>::
      push_back(&__return_storage_ptr__->m_fields,&fStack_c8);
      field_t::~field_t(&fStack_c8);
    }
  }
  bVar2 = tag_t<cfgfile::string_trait_t>::is_defined
                    (&(this->m_no_value_tags).super_tag_t<cfgfile::string_trait_t>);
  if (bVar2) {
    for (uVar4 = 0;
        uVar4 < (ulong)((long)(this->m_no_value_tags).m_tags.
                              super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_no_value_tags).m_tags.
                              super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4); uVar4 = uVar4 + 1) {
      ptVar3 = tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>::
               at(&this->m_no_value_tags,uVar4);
      tag_field_t::cfg(&fStack_c8,ptVar3);
      std::
      vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>::
      push_back(&__return_storage_ptr__->m_fields,&fStack_c8);
      field_t::~field_t(&fStack_c8);
    }
  }
  bVar2 = tag_t<cfgfile::string_trait_t>::is_defined
                    (&(this->m_scalar_vector_tags).super_tag_t<cfgfile::string_trait_t>);
  if (bVar2) {
    for (uVar4 = 0;
        uVar4 < (ulong)((long)(this->m_scalar_vector_tags).m_tags.
                              super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_scalar_vector_tags).m_tags.
                              super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4); uVar4 = uVar4 + 1) {
      ptVar3 = tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>::
               at(&this->m_scalar_vector_tags,uVar4);
      tag_field_t::cfg(&fStack_c8,ptVar3);
      std::
      vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>::
      push_back(&__return_storage_ptr__->m_fields,&fStack_c8);
      field_t::~field_t(&fStack_c8);
    }
  }
  bVar2 = tag_t<cfgfile::string_trait_t>::is_defined
                    (&(this->m_vector_of_tags_tags).super_tag_t<cfgfile::string_trait_t>);
  if (bVar2) {
    for (uVar4 = 0;
        uVar4 < (ulong)((long)(this->m_vector_of_tags_tags).m_tags.
                              super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_vector_of_tags_tags).m_tags.
                              super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4); uVar4 = uVar4 + 1) {
      ptVar3 = tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>::
               at(&this->m_vector_of_tags_tags,uVar4);
      tag_field_t::cfg(&fStack_c8,ptVar3);
      std::
      vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>::
      push_back(&__return_storage_ptr__->m_fields,&fStack_c8);
      field_t::~field_t(&fStack_c8);
    }
  }
  bVar2 = tag_t<cfgfile::string_trait_t>::is_defined
                    (&(this->m_custom_tags).super_tag_t<cfgfile::string_trait_t>);
  if (bVar2) {
    for (uVar4 = 0;
        uVar4 < (ulong)((long)(this->m_custom_tags).m_tags.
                              super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_custom_tags).m_tags.
                              super__Vector_base<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>,_std::allocator<std::shared_ptr<cfgfile::generator::cfg::tag_field_t>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4); uVar4 = uVar4 + 1) {
      ptVar3 = tag_vector_of_tags_t<cfgfile::generator::cfg::tag_field_t,_cfgfile::string_trait_t>::
               at(&this->m_custom_tags,uVar4);
      tag_field_t::cfg(&fStack_c8,ptVar3);
      std::
      vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>::
      push_back(&__return_storage_ptr__->m_fields,&fStack_c8);
      field_t::~field_t(&fStack_c8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

class_t
tag_class_t::cfg() const
{
	class_t c;
	c.set_name( value() );

	if( m_base_class_name.is_defined() )
	{
		c.set_base_name( m_base_class_name.value() );

		c.set_tag_name( m_base_class_name.tag_name() );

		if( c.base_name() != c_no_value_tag_name )
		{
			c.set_base_value_type( m_base_class_name.value_type() );

			c.add_field( m_base_class_name.cfg() );
		}
	}

	c.set_line_number( line_number() );
	c.set_column_number( column_number() );

	if( m_scalar_tags.is_defined() )
	{
		for( std::size_t i = 0; i < m_scalar_tags.size(); ++i )
			c.add_field( m_scalar_tags.at( i ).cfg() );
	}

	if( m_no_value_tags.is_defined() )
	{
		for( std::size_t i = 0; i < m_no_value_tags.size(); ++i )
			c.add_field( m_no_value_tags.at( i ).cfg() );
	}

	if( m_scalar_vector_tags.is_defined() )
	{
		for( std::size_t i = 0; i < m_scalar_vector_tags.size(); ++i )
			c.add_field( m_scalar_vector_tags.at( i ).cfg() );
	}

	if( m_vector_of_tags_tags.is_defined() )
	{
		for( std::size_t i = 0; i < m_vector_of_tags_tags.size(); ++i )
			c.add_field( m_vector_of_tags_tags.at( i ).cfg() );
	}

	if( m_custom_tags.is_defined() )
	{
		for( std::size_t i = 0; i < m_custom_tags.size(); ++i )
			c.add_field( m_custom_tags.at( i ).cfg() );
	}

	return c;
}